

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_slte(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint uVar1;
  BtorSimBitVector *pBVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  
  pBVar2 = btorsim_bv_new(1);
  uVar1 = a->len;
  uVar4 = a->width - 1;
  bVar5 = ((&a[1].width)[~(uVar4 >> 5) + uVar1] >> (uVar4 & 0x1f) & 1) != 0;
  uVar4 = b->width - 1;
  bVar6 = ((&b[1].width)[~(uVar4 >> 5) + b->len] >> (uVar4 & 0x1f) & 1) != 0;
  if (bVar5 == bVar6) {
    uVar3 = 0;
    if ((ulong)uVar1 != 0) {
      do {
        if ((&a[1].width)[uVar3] != (&b[1].width)[uVar3]) goto LAB_001148d7;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      uVar3 = (ulong)uVar1;
    }
LAB_001148d7:
    if (uVar1 <= (uint)uVar3) goto LAB_001148f6;
    bVar5 = (&a[1].width)[uVar3 & 0xffffffff] <= (&b[1].width)[uVar3 & 0xffffffff];
  }
  else {
    bVar5 = bVar5 && !bVar6;
  }
  if (!bVar5) {
    (&pBVar2[1].width)[pBVar2->len - 1] = (&pBVar2[1].width)[pBVar2->len - 1] & 0xfffffffe;
    return pBVar2;
  }
LAB_001148f6:
  (&pBVar2[1].width)[pBVar2->len - 1] = (&pBVar2[1].width)[pBVar2->len - 1] | 1;
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_slte (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint32_t i, bit, sign_a, sign_b;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  bit = 1;

  sign_a = btorsim_bv_get_bit (a, a->width - 1);
  sign_b = btorsim_bv_get_bit (b, b->width - 1);

  if (sign_a == sign_b)
  {
    i = find_diff_index (a, b);
    if (i < a->len && a->bits[i] > b->bits[i]) bit = 0;
  }
  else
  {
    bit = sign_a && !sign_b;
  }

  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}